

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest20_21::deinit(FunctionalTest20_21 *this)

{
  undefined4 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  GLuint i;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 4) {
    if (*(int *)((long)this->m_program_pipelines + lVar3) != 0) {
      puVar1 = (undefined4 *)((long)this->m_program_pipelines + lVar3);
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x450))(1,puVar1);
      *puVar1 = 0;
    }
  }
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    if (this->m_shared_contexts[lVar3] != (RenderContext *)0x0) {
      (*this->m_shared_contexts[lVar3]->_vptr_RenderContext[1])();
      this->m_shared_contexts[lVar3] = (RenderContext *)0x0;
    }
  }
  (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[8])();
  return;
}

Assistant:

void FunctionalTest20_21::deinit()
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (GLuint i = 0; i < m_n_shared_contexts + 1; ++i)
	{
		if (0 != m_program_pipelines[i])
		{
			gl.deleteProgramPipelines(1, &m_program_pipelines[i]);
			m_program_pipelines[i] = 0;
		}
	}

	for (GLuint i = 0; i < m_n_shared_contexts; ++i)
	{
		if (0 != m_shared_contexts[i])
		{
			delete m_shared_contexts[i];
			m_shared_contexts[i] = 0;
		}
	}

	m_context.getRenderContext().makeCurrent();
}